

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitAssignmentToDefaultModuleExport
          (ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  ModuleID moduleId;
  uint slotId2;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  SourceTextModuleRecord *this_02;
  ByteCodeWriter *this_03;
  uint moduleSlotIndex;
  SourceTextModuleRecord *moduleRecord;
  JavascriptLibrary *library;
  uint moduleIndex;
  FuncInfo *funcInfo_local;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  moduleId = GetModuleID(this);
  this_00 = GetScriptContext(this);
  this_01 = Js::ScriptContext::GetLibrary(this_00);
  Js::JavascriptLibrary::EnsureModuleRecordList(this_01);
  this_02 = Js::JavascriptLibrary::GetModuleRecord(this_01,moduleId);
  slotId2 = Js::SourceTextModuleRecord::GetLocalExportSlotIndexByExportName(this_02,0x6e);
  this_03 = Writer(this);
  Js::ByteCodeWriter::SlotI2(this_03,StModuleSlot,pnode->location,moduleId,slotId2);
  return;
}

Assistant:

void ByteCodeGenerator::EmitAssignmentToDefaultModuleExport(ParseNode* pnode, FuncInfo* funcInfo)
{
    // We are assigning pnode to the default export of the current module.
    uint moduleIndex = this->GetModuleID();

    Js::JavascriptLibrary* library = this->GetScriptContext()->GetLibrary();
    library->EnsureModuleRecordList();
    Js::SourceTextModuleRecord* moduleRecord = library->GetModuleRecord(moduleIndex);
    uint moduleSlotIndex = moduleRecord->GetLocalExportSlotIndexByExportName(Js::PropertyIds::default_);

    this->Writer()->SlotI2(Js::OpCode::StModuleSlot, pnode->location, moduleIndex, moduleSlotIndex);
}